

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void vm_free(VM *vm)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 8;
  for (lVar2 = 0; lVar2 < vm->fns_count; lVar2 = lVar2 + 1) {
    free(*(void **)((long)&vm->fns->pkg + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  free(vm->pkgs);
  free(vm->fns);
  free(vm->consts);
  free(vm->stack);
  return;
}

Assistant:

void vm_free(VM *vm) {
	for (int i = 0; i < vm->fns_count; i++) {
		free(vm->fns[i].ins);
	}
	free(vm->pkgs);
	free(vm->fns);
	free(vm->consts);
	free(vm->stack);
}